

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_CCtx_params *in_RDI;
  undefined1 auVar1 [12];
  undefined1 auVar2 [24];
  undefined1 auVar3 [32];
  undefined1 auVar4 [28];
  int in_stack_00000008;
  int in_stack_0000000c;
  
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(in_RDI->ldmParams).hashRateLog = auVar3;
  auVar2 = auVar3._0_24_;
  (in_RDI->ldmParams).enableLdm = auVar2._0_4_;
  (in_RDI->ldmParams).hashLog = auVar2._4_4_;
  (in_RDI->ldmParams).bucketSizeLog = auVar2._8_4_;
  (in_RDI->ldmParams).minMatchLength = auVar2._12_4_;
  (in_RDI->ldmParams).hashRateLog = auVar2._16_4_;
  (in_RDI->ldmParams).windowLog = auVar2._20_4_;
  (in_RDI->customMem).customAlloc = (ZSTD_allocFunction)auVar3._24_8_;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  in_RDI->srcSizeHint = auVar3._0_4_;
  in_RDI->attachDictPref = auVar3._4_4_;
  in_RDI->literalCompressionMode = auVar3._8_4_;
  in_RDI->nbWorkers = auVar3._12_4_;
  in_RDI->jobSize = auVar3._16_8_;
  in_RDI->overlapLog = auVar3._24_4_;
  in_RDI->rsyncable = auVar3._28_4_;
  auVar1 = auVar3._0_12_;
  (in_RDI->fParams).contentSizeFlag = auVar1._0_4_;
  (in_RDI->fParams).checksumFlag = auVar1._4_4_;
  (in_RDI->fParams).noDictIDFlag = auVar1._8_4_;
  in_RDI->compressionLevel = auVar3._12_4_;
  in_RDI->forceWindow = auVar3._16_4_;
  *(int *)&in_RDI->field_0x34 = auVar3._20_4_;
  in_RDI->targetCBlockSize = auVar3._24_8_;
  auVar4 = auVar3._4_28_;
  in_RDI->format = auVar3._0_4_;
  (in_RDI->cParams).windowLog = auVar4._0_4_;
  (in_RDI->cParams).chainLog = auVar4._4_4_;
  (in_RDI->cParams).hashLog = auVar4._8_4_;
  (in_RDI->cParams).searchLog = auVar4._12_4_;
  (in_RDI->cParams).minMatch = auVar4._16_4_;
  (in_RDI->cParams).targetLength = auVar4._20_4_;
  (in_RDI->cParams).strategy = auVar4._24_4_;
  (in_RDI->cParams).windowLog = in_stack_00000008;
  (in_RDI->cParams).chainLog = in_stack_0000000c;
  (in_RDI->cParams).hashLog = (int)cParams._0_8_;
  (in_RDI->cParams).searchLog = (int)((ulong)cParams._0_8_ >> 0x20);
  (in_RDI->cParams).searchLog = (int)cParams._4_8_;
  (in_RDI->cParams).minMatch = (int)((ulong)cParams._4_8_ >> 0x20);
  (in_RDI->cParams).targetLength = (int)cParams._12_8_;
  (in_RDI->cParams).strategy = (int)((ulong)cParams._12_8_ >> 0x20);
  in_RDI->compressionLevel = 3;
  if ((((0xffffffe9 < in_stack_00000008 - 0x20U) && (0xffffffe6 < in_stack_0000000c - 0x1fU)) &&
      (0xffffffe6 < cParams.windowLog - 0x1f)) &&
     (((0xffffffe1 < cParams.chainLog - 0x1f && (cParams.hashLog - 3 < 5)) &&
      ((cParams.searchLog < 0x20001 && (cParams.minMatch - 1 < 9)))))) {
    (in_RDI->fParams).contentSizeFlag = 1;
    return in_RDI;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2b0f,
                "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    memset(&cctxParams, 0, sizeof(cctxParams));
    cctxParams.cParams = cParams;
    cctxParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;  /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(cParams));
    cctxParams.fParams.contentSizeFlag = 1;
    return cctxParams;
}